

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O0

void __thiscall
MenuBar::bindSlot(MenuBar *this,ActionMenu actionMenu,function<void_()> *slot,
                 QMainWindow *mainWindow,QString *text)

{
  QString *pQVar1;
  pointer ppVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_ActionMenu,_QAction>_>,_bool> pVar3;
  function<void_()> local_88;
  Object local_68 [8];
  type_conflict4 *local_60;
  type_conflict4 *_;
  type *it;
  undefined1 local_48;
  pair<std::_Rb_tree_iterator<std::pair<const_ActionMenu,_QAction>_>,_bool> local_40;
  QString *local_30;
  QString *text_local;
  QMainWindow *mainWindow_local;
  function<void_()> *slot_local;
  MenuBar *pMStack_10;
  ActionMenu actionMenu_local;
  MenuBar *this_local;
  
  local_30 = text;
  text_local = (QString *)mainWindow;
  mainWindow_local = (QMainWindow *)slot;
  slot_local._4_4_ = actionMenu;
  pMStack_10 = this;
  pVar3 = std::
          map<ActionMenu,QAction,std::less<ActionMenu>,std::allocator<std::pair<ActionMenu_const,QAction>>>
          ::emplace<ActionMenu&,QMainWindow*&>
                    ((map<ActionMenu,QAction,std::less<ActionMenu>,std::allocator<std::pair<ActionMenu_const,QAction>>>
                      *)this,(ActionMenu *)((long)&slot_local + 4),(QMainWindow **)&text_local);
  it = (type *)pVar3.first._M_node;
  local_48 = pVar3.second;
  local_40.first._M_node = (_Base_ptr)it;
  local_40.second = (bool)local_48;
  _ = (type_conflict4 *)
      std::get<0ul,std::_Rb_tree_iterator<std::pair<ActionMenu_const,QAction>>,bool>(&local_40);
  local_60 = std::get<1ul,std::_Rb_tree_iterator<std::pair<ActionMenu_const,QAction>>,bool>
                       (&local_40);
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_ActionMenu,_QAction>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_ActionMenu,_QAction>_> *)_);
  QAction::setText((QString *)&ppVar2->second);
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_ActionMenu,_QAction>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_ActionMenu,_QAction>_> *)_);
  pQVar1 = text_local;
  std::function<void_()>::function(&local_88,slot);
  QObject::connect<void(QAction::*)(bool),std::function<void()>>
            (local_68,(offset_in_QAction_to_subr)&ppVar2->second,(QObject *)QAction::triggered,
             (function<void_()> *)0x0,(ConnectionType)pQVar1);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  std::function<void_()>::~function(&local_88);
  return;
}

Assistant:

void MenuBar::bindSlot( ActionMenu actionMenu, std::function<void( void )> slot, QMainWindow* mainWindow, const QString& text )
{
    auto [it, _] = mapAction.emplace( actionMenu, mainWindow );
    it->second.setText( text );
    QObject::connect( &it->second, &QAction::triggered, mainWindow, slot );
}